

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

bool __thiscall kws::Parser::IsInComments(Parser *this,size_t pos)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ulong in_RSI;
  long in_RDI;
  size_t b1;
  size_t b0;
  ulong local_28;
  ulong local_20;
  
  if (((in_RSI != 0xffffffffffffffff) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0))
     && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    local_20 = std::__cxx11::string::find((string *)(in_RDI + 0x4f8),in_RDI + 0x5c8);
    if (local_20 == 0xffffffffffffffff) {
      return false;
    }
    local_28 = std::__cxx11::string::find((string *)(in_RDI + 0x4f8),in_RDI + 0x608);
    while( true ) {
      bVar1 = false;
      if ((local_20 != 0xffffffffffffffff) && (bVar1 = false, local_28 != 0xffffffffffffffff)) {
        bVar1 = local_20 < local_28;
      }
      if (!bVar1) break;
      if ((local_20 <= in_RSI) && (lVar3 = std::__cxx11::string::size(), in_RSI <= local_28 + lVar3)
         ) {
        return true;
      }
      local_20 = std::__cxx11::string::find((string *)(in_RDI + 0x4f8),in_RDI + 0x5c8);
      local_28 = std::__cxx11::string::find((string *)(in_RDI + 0x4f8),in_RDI + 0x608);
    }
    return false;
  }
  return false;
}

Assistant:

bool Parser::IsInComments(size_t pos) const
{
  if ((pos == std::string::npos) || (m_CommentBegin.empty()) ||
      (m_CommentEnd.empty())) {
    return false;
  }

  size_t b0 = m_Buffer.find(m_CommentBegin,0);

  if(b0 == std::string::npos)
   {
   return false;
   }

  size_t b1 = m_Buffer.find(m_CommentEnd,b0);

  while(b0 != std::string::npos && b1 != std::string::npos && b1>b0)
    {
    if(pos>=b0 && pos<=(b1+m_CommentEnd.size()))
      {
      return true;
      }
    b0 = m_Buffer.find(m_CommentBegin,b0+1);
    b1 = m_Buffer.find(m_CommentEnd,b0);
    }

  return false;
}